

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_insertBt1(ZSTD_matchState_t *ms,ZSTD_compressionParameters *cParams,BYTE *ip,BYTE *iend,
                  U32 mls,U32 extDict)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *mEnd;
  size_t sVar5;
  BYTE *pBVar6;
  BYTE *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R9D;
  size_t matchLength;
  U32 *nextPtr;
  U32 nbCompares;
  size_t bestLength;
  U32 matchEndIdx;
  U32 windowLow;
  U32 dummy32;
  U32 *largerPtr;
  U32 *smallerPtr;
  U32 btLow;
  U32 current;
  BYTE *match;
  BYTE *prefixStart;
  BYTE *dictEnd;
  U32 dictLimit;
  BYTE *dictBase;
  BYTE *base;
  size_t commonLengthLarger;
  size_t commonLengthSmaller;
  U32 matchIndex;
  U32 btMask;
  U32 btLog;
  U32 *bt;
  size_t h;
  U32 hashLog;
  U32 *hashTable;
  U32 in_stack_ffffffffffffff00;
  U32 in_stack_ffffffffffffff04;
  void *in_stack_ffffffffffffff08;
  uint local_ec;
  undefined4 in_stack_ffffffffffffff28;
  BYTE *match_00;
  undefined4 in_stack_ffffffffffffff38;
  uint local_bc;
  uint *local_b8;
  uint *local_b0;
  uint local_a8;
  uint local_a4;
  long local_a0;
  long local_98;
  long local_90;
  uint local_84;
  long local_80;
  long local_78;
  BYTE *local_70;
  BYTE *local_68;
  uint local_5c;
  uint local_58;
  int local_54;
  long local_50;
  size_t local_48;
  undefined4 local_3c;
  long local_38;
  int local_30;
  BYTE *local_28;
  long local_20;
  long local_18;
  long local_10;
  U32 local_4;
  
  local_38 = *(long *)(in_RDI + 0x30);
  local_3c = *(undefined4 *)(in_RSI + 8);
  local_30 = in_R9D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_48 = ZSTD_hashPtr(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                          in_stack_ffffffffffffff00);
  local_50 = *(long *)(local_10 + 0x40);
  local_54 = *(int *)(local_18 + 4) + -1;
  local_58 = (1 << ((byte)local_54 & 0x1f)) - 1;
  local_5c = *(uint *)(local_38 + local_48 * 4);
  local_68 = (BYTE *)0x0;
  local_70 = (BYTE *)0x0;
  local_78 = *(long *)(local_10 + 8);
  local_80 = *(long *)(local_10 + 0x10);
  local_84 = *(uint *)(local_10 + 0x18);
  local_90 = local_80 + (ulong)local_84;
  local_98 = local_78 + (ulong)local_84;
  local_a4 = (int)local_20 - (int)local_78;
  if (local_58 < local_a4) {
    local_ec = local_a4 - local_58;
  }
  else {
    local_ec = 0;
  }
  local_a8 = local_ec;
  local_b0 = (uint *)(local_50 + (ulong)((local_a4 & local_58) << 1) * 4);
  uVar1 = *(uint *)(local_10 + 0x1c);
  iVar2 = local_a4 + 9;
  match_00 = (BYTE *)0x8;
  iVar3 = 1 << ((byte)*(undefined4 *)(local_18 + 0xc) & 0x1f);
  *(uint *)(local_38 + local_48 * 4) = local_a4;
  local_b8 = local_b0 + 1;
LAB_0023fb42:
  do {
    iVar4 = iVar3 + -1;
    if (iVar3 == 0 || local_5c <= uVar1) {
LAB_0023fde7:
      *local_b8 = 0;
      *local_b0 = 0;
      if (match_00 < (BYTE *)0x181) {
        local_4 = iVar2 - (local_a4 + 8);
      }
      else if ((int)match_00 - 0x180U < 0xc1) {
        local_4 = (int)match_00 - 0x180;
      }
      else {
        local_4 = 0xc0;
      }
      return local_4;
    }
    mEnd = (uint *)(local_50 + (ulong)((local_5c & local_58) << 1) * 4);
    pBVar6 = local_70;
    if (local_68 < local_70) {
      pBVar6 = local_68;
    }
    if ((local_30 == 0) || ((BYTE *)(ulong)local_84 <= pBVar6 + local_5c)) {
      local_a0 = local_78 + (ulong)local_5c;
      sVar5 = ZSTD_count((BYTE *)CONCAT44(iVar2,in_stack_ffffffffffffff38),match_00,
                         (BYTE *)CONCAT44(iVar4,in_stack_ffffffffffffff28));
      pBVar6 = pBVar6 + sVar5;
      iVar3 = iVar4;
    }
    else {
      local_a0 = local_80 + (ulong)local_5c;
      sVar5 = ZSTD_count_2segments
                        ((BYTE *)CONCAT44(iVar2,in_stack_ffffffffffffff38),match_00,
                         (BYTE *)CONCAT44(iVar4,in_stack_ffffffffffffff28),(BYTE *)mEnd,pBVar6);
      pBVar6 = pBVar6 + sVar5;
      iVar3 = iVar4;
      if ((BYTE *)(ulong)local_84 <= pBVar6 + local_5c) {
        local_a0 = local_78 + (ulong)local_5c;
      }
    }
    if ((match_00 < pBVar6) && (match_00 = pBVar6, (BYTE *)(ulong)(iVar2 - local_5c) < pBVar6)) {
      iVar2 = local_5c + (int)pBVar6;
    }
    if (pBVar6 + local_20 == local_28) goto LAB_0023fde7;
    if (pBVar6[local_20] <= pBVar6[local_a0]) {
      *local_b8 = local_5c;
      if (local_5c <= local_a8) {
        local_b8 = &local_bc;
        goto LAB_0023fde7;
      }
      local_5c = *mEnd;
      local_b8 = mEnd;
      local_70 = pBVar6;
      goto LAB_0023fb42;
    }
    *local_b0 = local_5c;
    if (local_5c <= local_a8) {
      local_b0 = &local_bc;
      goto LAB_0023fde7;
    }
    local_b0 = mEnd + 1;
    local_5c = mEnd[1];
    local_68 = pBVar6;
  } while( true );
}

Assistant:

static U32 ZSTD_insertBt1(
                ZSTD_matchState_t* ms, ZSTD_compressionParameters const* cParams,
                const BYTE* const ip, const BYTE* const iend,
                U32 const mls, U32 const extDict)
{
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32 matchIndex = hashTable[h];
    size_t commonLengthSmaller=0, commonLengthLarger=0;
    const BYTE* const base = ms->window.base;
    const BYTE* const dictBase = ms->window.dictBase;
    const U32 dictLimit = ms->window.dictLimit;
    const BYTE* const dictEnd = dictBase + dictLimit;
    const BYTE* const prefixStart = base + dictLimit;
    const BYTE* match;
    const U32 current = (U32)(ip-base);
    const U32 btLow = btMask >= current ? 0 : current - btMask;
    U32* smallerPtr = bt + 2*(current&btMask);
    U32* largerPtr  = smallerPtr + 1;
    U32 dummy32;   /* to be nullified at the end */
    U32 const windowLow = ms->window.lowLimit;
    U32 matchEndIdx = current+8+1;
    size_t bestLength = 8;
    U32 nbCompares = 1U << cParams->searchLog;
#ifdef ZSTD_C_PREDICT
    U32 predictedSmall = *(bt + 2*((current-1)&btMask) + 0);
    U32 predictedLarge = *(bt + 2*((current-1)&btMask) + 1);
    predictedSmall += (predictedSmall>0);
    predictedLarge += (predictedLarge>0);
#endif /* ZSTD_C_PREDICT */

    DEBUGLOG(8, "ZSTD_insertBt1 (%u)", current);

    assert(ip <= iend-8);   /* required for h calculation */
    hashTable[h] = current;   /* Update Hash Table */

    while (nbCompares-- && (matchIndex > windowLow)) {
        U32* const nextPtr = bt + 2*(matchIndex & btMask);
        size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
        assert(matchIndex < current);

#ifdef ZSTD_C_PREDICT   /* note : can create issues when hlog small <= 11 */
        const U32* predictPtr = bt + 2*((matchIndex-1) & btMask);   /* written this way, as bt is a roll buffer */
        if (matchIndex == predictedSmall) {
            /* no need to check length, result known */
            *smallerPtr = matchIndex;
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
            matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            predictedSmall = predictPtr[1] + (predictPtr[1]>0);
            continue;
        }
        if (matchIndex == predictedLarge) {
            *largerPtr = matchIndex;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
            predictedLarge = predictPtr[0] + (predictPtr[0]>0);
            continue;
        }
#endif

        if ((!extDict) || (matchIndex+matchLength >= dictLimit)) {
            assert(matchIndex+matchLength >= dictLimit);   /* might be wrong if extDict is incorrectly set to 0 */
            match = base + matchIndex;
            matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
        } else {
            match = dictBase + matchIndex;
            matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
            if (matchIndex+matchLength >= dictLimit)
                match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
        }

        if (matchLength > bestLength) {
            bestLength = matchLength;
            if (matchLength > matchEndIdx - matchIndex)
                matchEndIdx = matchIndex + (U32)matchLength;
        }

        if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
            break;   /* drop , to guarantee consistency ; miss a bit of compression, but other solutions can corrupt tree */
        }

        if (match[matchLength] < ip[matchLength]) {  /* necessarily within buffer */
            /* match is smaller than current */
            *smallerPtr = matchIndex;             /* update smaller idx */
            commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
            if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            smallerPtr = nextPtr+1;               /* new "candidate" => larger than match, which was smaller than target */
            matchIndex = nextPtr[1];              /* new matchIndex, larger than previous and closer to current */
        } else {
            /* match is larger than current */
            *largerPtr = matchIndex;
            commonLengthLarger = matchLength;
            if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop searching */
            largerPtr = nextPtr;
            matchIndex = nextPtr[0];
    }   }

    *smallerPtr = *largerPtr = 0;
    if (bestLength > 384) return MIN(192, (U32)(bestLength - 384));   /* speed optimization */
    assert(matchEndIdx > current + 8);
    return matchEndIdx - (current + 8);
}